

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O1

void R_RenderFakeWallRange(drawseg_t *ds,int x1,int x2)

{
  double dVar1;
  uint uVar2;
  sector_t *psVar3;
  secplane_t *psVar4;
  secplane_t *psVar5;
  extsector_t *peVar6;
  bool bVar7;
  int iVar8;
  FTexture *pFVar9;
  long lVar10;
  ulong uVar11;
  side_t **ppsVar12;
  F3DFloor *rover;
  uint uVar13;
  long lVar14;
  F3DFloor *pFVar15;
  ulong uVar16;
  lightlist_t *plVar17;
  uint uVar18;
  ulong uVar19;
  seg_t **ppsVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  sprflipvert = false;
  curline = ds->curline;
  ppsVar20 = &curline;
  psVar3 = curline->frontsector;
  backsector = curline->backsector;
  if (backsector == (sector_t *)0x0) {
    frontsector = psVar3;
    sprflipvert = false;
    return;
  }
  frontsector = psVar3;
  if ((ds->bFakeBoundary & 3) == 2) {
    frontsector = backsector;
    backsector = psVar3;
  }
  dVar22 = (backsector->centerspot).X;
  dVar24 = (backsector->centerspot).Y;
  dVar23 = ((backsector->floorplane).normal.Y * dVar24 +
           (backsector->floorplane).normal.X * dVar22 + (backsector->floorplane).D) *
           (backsector->floorplane).negiC;
  if ((fake3D & 1U) == 0) {
    sclipBottom = dVar23;
  }
  dVar22 = (dVar24 * (backsector->ceilingplane).normal.Y +
           dVar22 * (backsector->ceilingplane).normal.X + (backsector->ceilingplane).D) *
           (backsector->ceilingplane).negiC;
  if ((fake3D & 2U) == 0) {
    sclipTop = dVar22;
  }
  dVar24 = (frontsector->centerspot).X;
  dVar1 = (frontsector->centerspot).Y;
  if (((frontsector->ceilingplane).normal.Y * dVar1 +
      (frontsector->ceilingplane).normal.X * dVar24 + (frontsector->ceilingplane).D) *
      (frontsector->ceilingplane).negiC <= sclipBottom) {
    sprflipvert = false;
    return;
  }
  if (sclipTop <=
      (dVar1 * (frontsector->floorplane).normal.Y +
      dVar24 * (frontsector->floorplane).normal.X + (frontsector->floorplane).D) *
      (frontsector->floorplane).negiC) {
    sprflipvert = false;
    return;
  }
  uVar13 = (backsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
  if ((fake3D & 8U) != 0) {
    if ((int)(uVar13 - 1) < 0) {
      sprflipvert = false;
      return;
    }
    bVar21 = false;
    uVar19 = (ulong)(uVar13 - 1);
    do {
      rover = (backsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar19];
      uVar13 = rover->flags;
      if ((uVar13 & 1) != 0) {
        if ((((((uVar13 & 4) == 0) ||
              (psVar4 = (rover->top).plane, (psVar4->normal).Y != 0.0 || (psVar4->normal).X != 0.0))
             || (psVar5 = (rover->bottom).plane,
                (psVar5->normal).Y != 0.0 || (psVar5->normal).X != 0.0)) ||
            ((dVar24 = psVar4->D * psVar4->negiC, dVar24 <= sclipBottom ||
             (dVar22 <= psVar5->D * psVar5->negiC)))) || (dVar24 <= dVar23)) {
          if (uVar19 != 0) goto LAB_0030e1f0;
          bVar7 = true;
        }
        else {
          bVar7 = false;
        }
        rw_pic = (FTexture *)0x0;
        if ((bVar7) || (psVar4 = (rover->bottom).plane, sclipTop <= psVar4->D * psVar4->negiC)) {
          if (bVar21) {
            rw_pic = (FTexture *)0x0;
            sprflipvert = false;
            return;
          }
          uVar18 = (frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
          uVar19 = (ulong)uVar18;
          if ((int)(uVar18 - 1) < 0) goto LAB_0030e49c;
          goto LAB_0030e3ae;
        }
        uVar18 = (frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
        uVar16 = (ulong)uVar18;
        if (uVar18 == 0) {
          pFVar15 = (F3DFloor *)0x0;
          pFVar9 = rw_pic;
          goto LAB_0030e7ad;
        }
        if ((int)(uVar18 - 1) < 0) {
LAB_0030e1ce:
          bVar21 = true;
          pFVar15 = (F3DFloor *)0x0;
        }
        else {
          do {
            uVar18 = (int)uVar16 - 1;
            uVar16 = (ulong)uVar18;
            pFVar15 = (frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array
                      [uVar16];
            bVar21 = pFVar15->model == rover->model;
            if (bVar21) break;
            uVar2 = pFVar15->flags;
            if ((((~uVar2 & 5) == 0) &&
                (psVar4 = (pFVar15->top).plane,
                (psVar4->normal).Y == 0.0 && (psVar4->normal).X == 0.0)) &&
               ((psVar5 = (pFVar15->bottom).plane,
                (psVar5->normal).Y == 0.0 && (psVar5->normal).X == 0.0 &&
                (sclipBottom < psVar4->D * psVar4->negiC)))) {
              if (sclipTop <= psVar5->D * psVar5->negiC) goto LAB_0030e1ce;
              if (((uVar2 & 2) != (uVar13 & 2)) ||
                 (((uVar2 & 2) == 0 && ((pFVar15->alpha == 0xff || (rover->alpha == 0xff)))))) {
                if ((uVar13 & uVar2 & 0x10) != 0) {
                  rw_pic = (FTexture *)0xffffffffffffffff;
                }
                goto LAB_0030e1ce;
              }
              bVar21 = true;
              break;
            }
          } while (0 < (int)uVar18);
        }
        pFVar9 = rw_pic;
        if ((!bVar21) || (bVar21 = true, pFVar15 == (F3DFloor *)0x0)) goto LAB_0030e7ad;
      }
LAB_0030e1f0:
      bVar7 = (long)uVar19 < 1;
      uVar19 = uVar19 - 1;
      if (bVar7) {
        sprflipvert = false;
        return;
      }
    } while( true );
  }
  if ((int)uVar13 < 1) {
    sprflipvert = false;
    return;
  }
  uVar19 = 0;
  while( true ) {
    rover = (backsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar19];
    uVar18 = rover->flags;
    if ((uVar18 & 1) != 0) break;
LAB_0030dfcb:
    uVar19 = uVar19 + 1;
    if (uVar13 == uVar19) {
      sprflipvert = false;
      return;
    }
  }
  if (((((uVar18 & 4) == 0) ||
       (psVar4 = (rover->top).plane, (psVar4->normal).Y != 0.0 || (psVar4->normal).X != 0.0)) ||
      (psVar5 = (rover->bottom).plane, (psVar5->normal).Y != 0.0 || (psVar5->normal).X != 0.0)) ||
     (((dVar24 = psVar5->D * psVar5->negiC, sclipTop <= dVar24 ||
       (psVar4->D * psVar4->negiC <= dVar23)) || (dVar22 <= dVar24)))) {
    if (uVar13 - 1 != uVar19) goto LAB_0030dfcb;
    bVar21 = true;
  }
  else {
    bVar21 = false;
  }
  rw_pic = (FTexture *)0x0;
  peVar6 = frontsector->e;
  if ((bVar21) || (psVar4 = (rover->top).plane, psVar4->D * psVar4->negiC <= sclipBottom)) {
    uVar13 = (peVar6->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    if ((int)uVar13 < 1) {
      uVar19 = 0;
LAB_0030e43b:
      pFVar15 = (F3DFloor *)0x0;
    }
    else {
      uVar19 = 0;
      do {
        pFVar15 = (peVar6->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar19];
        if (pFVar15->model == rover->model) goto LAB_0030e43b;
        if (((((~pFVar15->flags & 5) == 0) &&
             (psVar4 = (pFVar15->top).plane, (psVar4->normal).Y == 0.0 && (psVar4->normal).X == 0.0)
             ) && (psVar5 = (pFVar15->bottom).plane,
                  (psVar5->normal).Y == 0.0 && (psVar5->normal).X == 0.0)) &&
           (psVar5->D * psVar5->negiC < sclipTop)) {
          if (psVar4->D * psVar4->negiC <= sclipBottom) goto LAB_0030e43b;
          if ((pFVar15->flags & 0x2200) == 0) {
            pFVar15 = (F3DFloor *)0x0;
          }
          goto LAB_0030e43d;
        }
        uVar19 = uVar19 + 1;
      } while (uVar13 != uVar19);
      uVar19 = (ulong)uVar13;
    }
LAB_0030e43d:
    if ((uint)uVar19 == uVar13) {
      rw_pic = (FTexture *)0x0;
      sprflipvert = false;
      return;
    }
    if (pFVar15 == (F3DFloor *)0x0) {
      rw_pic = (FTexture *)0x0;
      sprflipvert = false;
      return;
    }
    uVar13 = pFVar15->flags;
    pFVar9 = (FTexture *)0xffffffffffffffff;
    if ((uVar18 & uVar13 & 0x10) == 0) {
      if ((uVar13 >> 0x11 & 1) == 0) {
        if ((uVar13 >> 0x12 & 1) == 0) {
          ppsVar12 = pFVar15->master->sidedef;
          lVar10 = 0x60;
        }
        else {
          ppsVar12 = &curline->sidedef;
          lVar10 = 0x90;
        }
      }
      else {
        ppsVar12 = &curline->sidedef;
        lVar10 = 0x30;
      }
      pFVar9 = FTextureManager::operator()
                         (&TexMan,(FTextureID)*(int *)((long)(*ppsVar12)->textures + lVar10 + -0x10)
                          ,true);
    }
  }
  else {
    uVar13 = (peVar6->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    uVar16 = (ulong)uVar13;
    uVar19 = 0;
    if (uVar16 != 0) {
      if ((int)uVar13 < 1) {
LAB_0030e596:
        pFVar15 = (F3DFloor *)0x0;
        uVar11 = uVar19;
      }
      else {
        uVar19 = 0;
        while (pFVar15 = (peVar6->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar19]
              , uVar11 = uVar19, pFVar15->model != rover->model) {
          uVar13 = pFVar15->flags;
          if ((((~uVar13 & 5) == 0) &&
              (psVar4 = (pFVar15->top).plane, (psVar4->normal).Y == 0.0 && (psVar4->normal).X == 0.0
              )) && ((psVar5 = (pFVar15->bottom).plane,
                     (psVar5->normal).Y == 0.0 && (psVar5->normal).X == 0.0 &&
                     (psVar5->D * psVar5->negiC < sclipTop)))) {
            if (psVar4->D * psVar4->negiC <= sclipBottom) goto LAB_0030e596;
            if (((uVar13 & 2) != (uVar18 & 2)) ||
               (((uVar18 & 2) == 0 && ((pFVar15->alpha == 0xff || (rover->alpha == 0xff)))))) {
              if ((uVar18 & uVar13 & 0x10) != 0) {
                rw_pic = (FTexture *)0xffffffffffffffff;
              }
              goto LAB_0030e596;
            }
            break;
          }
          uVar19 = uVar19 + 1;
          uVar11 = uVar16;
          if (uVar16 == uVar19) break;
        }
      }
      if (pFVar15 != (F3DFloor *)0x0) {
        pFVar9 = rw_pic;
        if ((uint)uVar11 !=
            (frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count) {
          sprflipvert = false;
          return;
        }
        goto LAB_0030e5b0;
      }
    }
    pFVar15 = (F3DFloor *)0x0;
    pFVar9 = rw_pic;
  }
LAB_0030e5b0:
  rw_pic = pFVar9;
  if (rw_pic == (FTexture *)0x0) {
    lVar10 = 0x30;
    lVar14 = 0x10;
    ppsVar20 = &curline;
    if (((rover->flags >> 0x11 & 1) == 0) && (lVar10 = 0x90, (rover->flags >> 0x12 & 1) == 0)) {
      ppsVar20 = (seg_t **)&rover->master;
      lVar10 = 0x60;
      lVar14 = 0x48;
    }
    rw_pic = FTextureManager::operator()
                       (&TexMan,(FTextureID)
                                *(int *)(*(long *)((long)((line_t *)*ppsVar20)->args +
                                                  lVar14 + -0x2c) + lVar10),true);
    pFVar15 = (F3DFloor *)0x0;
  }
  basecolormap = frontsector->ColorMap;
  wallshade = ds->shade;
  if (fixedlightlev < 0) {
    if ((ds->bFakeBoundary & 3) == 2) {
      uVar13 = (backsector->e->XFloor).lightlist.Count;
      do {
        uVar13 = uVar13 - 1;
        if ((int)uVar13 < 0) goto LAB_0030e75d;
        uVar19 = (ulong)(uVar13 & 0x7fffffff);
        plVar17 = (backsector->e->XFloor).lightlist.Array;
      } while (plVar17[uVar19].plane.D * plVar17[uVar19].plane.negiC < sclipTop);
    }
    else {
      uVar13 = (frontsector->e->XFloor).lightlist.Count;
      do {
        uVar13 = uVar13 - 1;
        if ((int)uVar13 < 0) goto LAB_0030e75d;
        uVar19 = (ulong)(uVar13 & 0x7fffffff);
        plVar17 = (frontsector->e->XFloor).lightlist.Array;
      } while (plVar17[uVar19].plane.D * plVar17[uVar19].plane.negiC < sclipTop);
    }
    basecolormap = plVar17[uVar19].extra_colormap;
    iVar8 = side_t::GetLightLevel
                      (curline->sidedef,foggy,(int)*plVar17[uVar19].p_lightlevel,
                       plVar17[uVar19].lightsource != (F3DFloor *)0x0,(int *)0x0);
    wallshade = (iVar8 + r_actualextralight) * -0x4000 + 0x3d0000;
  }
LAB_0030e75d:
  if (rw_pic == (FTexture *)0xffffffffffffffff) {
    rw_pic = (FTexture *)0x0;
    return;
  }
  if (pFVar15 != (F3DFloor *)0x0) {
    rover = pFVar15;
  }
  goto LAB_0030e976;
LAB_0030e49c:
  pFVar15 = (F3DFloor *)0x0;
  goto LAB_0030e49e;
  while( true ) {
    if (((((~pFVar15->flags & 5) == 0) &&
         (psVar4 = (pFVar15->top).plane, (psVar4->normal).Y == 0.0 && (psVar4->normal).X == 0.0)) &&
        (psVar5 = (pFVar15->bottom).plane, (psVar5->normal).Y == 0.0 && (psVar5->normal).X == 0.0))
       && (sclipBottom < psVar4->D * psVar4->negiC)) {
      if (sclipTop <= psVar5->D * psVar5->negiC) {
        pFVar15 = (F3DFloor *)0x0;
      }
      else if ((pFVar15->flags & 0x2200) == 0) {
        pFVar15 = (F3DFloor *)0x0;
      }
      goto LAB_0030e49e;
    }
    if ((int)(uVar18 - 1) < 1) break;
LAB_0030e3ae:
    uVar18 = (uint)uVar19;
    uVar19 = (ulong)(uVar18 - 1);
    pFVar15 = (frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar19];
    if (pFVar15->model == rover->model) goto LAB_0030e49c;
  }
  uVar18 = 0;
LAB_0030e49e:
  if (uVar18 == 0) {
    rw_pic = (FTexture *)0x0;
    sprflipvert = false;
    return;
  }
  if (pFVar15 == (F3DFloor *)0x0) {
    rw_pic = (FTexture *)0x0;
    sprflipvert = false;
    return;
  }
  uVar18 = pFVar15->flags;
  pFVar9 = (FTexture *)0xffffffffffffffff;
  if ((uVar13 & uVar18 & 0x10) == 0) {
    if ((uVar18 >> 0x11 & 1) == 0) {
      if ((uVar18 >> 0x12 & 1) == 0) {
        ppsVar12 = pFVar15->master->sidedef;
        lVar10 = 0x60;
      }
      else {
        ppsVar12 = &curline->sidedef;
        lVar10 = 0x90;
      }
    }
    else {
      ppsVar12 = &curline->sidedef;
      lVar10 = 0x30;
    }
    pFVar9 = FTextureManager::operator()
                       (&TexMan,(FTextureID)*(int *)((long)(*ppsVar12)->textures + lVar10 + -0x10),
                        true);
  }
LAB_0030e7ad:
  rw_pic = pFVar9;
  if (rw_pic == (FTexture *)0x0) {
    lVar10 = 0x30;
    lVar14 = 0x10;
    if (((rover->flags >> 0x11 & 1) == 0) && (lVar10 = 0x90, (rover->flags >> 0x12 & 1) == 0)) {
      ppsVar20 = (seg_t **)&rover->master;
      lVar10 = 0x60;
      lVar14 = 0x48;
    }
    rw_pic = FTextureManager::operator()
                       (&TexMan,(FTextureID)
                                *(int *)(*(long *)((long)((line_t *)*ppsVar20)->args +
                                                  lVar14 + -0x2c) + lVar10),true);
    pFVar15 = (F3DFloor *)0x0;
  }
  basecolormap = frontsector->ColorMap;
  wallshade = ds->shade;
  if (fixedlightlev < 0) {
    if ((ds->bFakeBoundary & 3) == 2) {
      uVar13 = (backsector->e->XFloor).lightlist.Count;
      do {
        uVar13 = uVar13 - 1;
        if ((int)uVar13 < 0) goto LAB_0030e954;
        uVar19 = (ulong)(uVar13 & 0x7fffffff);
        plVar17 = (backsector->e->XFloor).lightlist.Array;
      } while (plVar17[uVar19].plane.D * plVar17[uVar19].plane.negiC < sclipTop);
    }
    else {
      uVar13 = (frontsector->e->XFloor).lightlist.Count;
      do {
        uVar13 = uVar13 - 1;
        if ((int)uVar13 < 0) goto LAB_0030e954;
        uVar19 = (ulong)(uVar13 & 0x7fffffff);
        plVar17 = (frontsector->e->XFloor).lightlist.Array;
      } while (plVar17[uVar19].plane.D * plVar17[uVar19].plane.negiC < sclipTop);
    }
    basecolormap = plVar17[uVar19].extra_colormap;
    iVar8 = side_t::GetLightLevel
                      (curline->sidedef,foggy,(int)*plVar17[uVar19].p_lightlevel,
                       plVar17[uVar19].lightsource != (F3DFloor *)0x0,(int *)0x0);
    wallshade = (iVar8 + r_actualextralight) * -0x4000 + 0x3d0000;
  }
LAB_0030e954:
  if (rw_pic == (FTexture *)0xffffffffffffffff) {
    rw_pic = (FTexture *)0x0;
    return;
  }
  if (pFVar15 != (F3DFloor *)0x0) {
    rover = pFVar15;
  }
LAB_0030e976:
  R_RenderFakeWall(ds,x1,x2,rover);
  return;
}

Assistant:

void R_RenderFakeWallRange (drawseg_t *ds, int x1, int x2)
{
	FTexture *const DONT_DRAW = ((FTexture*)(intptr_t)-1);
	int i,j;
	F3DFloor *rover, *fover = NULL;
	int passed, last;
	double floorHeight;
	double ceilingHeight;

	sprflipvert = false;
	curline = ds->curline;

	frontsector = curline->frontsector;
	backsector = curline->backsector;

	if (backsector == NULL)
	{
		return;
	}
	if ((ds->bFakeBoundary & 3) == 2)
	{
		sector_t *sec = backsector;
		backsector = frontsector;
		frontsector = sec;
	}

	floorHeight = backsector->CenterFloor();
	ceilingHeight = backsector->CenterCeiling();

	// maybe fix clipheights
	if (!(fake3D & FAKE3D_CLIPBOTTOM)) sclipBottom = floorHeight;
	if (!(fake3D & FAKE3D_CLIPTOP))    sclipTop = ceilingHeight;

	// maybe not visible
	if (sclipBottom >= frontsector->CenterCeiling()) return;
	if (sclipTop <= frontsector->CenterFloor()) return;

	if (fake3D & FAKE3D_DOWN2UP)
	{ // bottom to viewz
		last = 0;
		for (i = backsector->e->XFloor.ffloors.Size() - 1; i >= 0; i--) 
		{
			rover = backsector->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_EXISTS)) continue;

			// visible?
			passed = 0;
			if (!(rover->flags & FF_RENDERSIDES) || rover->top.plane->isSlope() || rover->bottom.plane->isSlope() ||
				rover->top.plane->Zat0() <= sclipBottom ||
				rover->bottom.plane->Zat0() >= ceilingHeight ||
				rover->top.plane->Zat0() <= floorHeight)
			{
				if (!i)
				{
					passed = 1;
				}
				else
				{
					continue;
				}
			}

			rw_pic = NULL;
			if (rover->bottom.plane->Zat0() >= sclipTop || passed) 
			{
				if (last)
				{
					break;
				}
				// maybe wall from inside rendering?
				fover = NULL;
				for (j = frontsector->e->XFloor.ffloors.Size() - 1; j >= 0; j--)
				{
					fover = frontsector->e->XFloor.ffloors[j];
					if (fover->model == rover->model)
					{ // never
						fover = NULL;
						break;
					}
					if (!(fover->flags & FF_EXISTS)) continue;
					if (!(fover->flags & FF_RENDERSIDES)) continue;
					// no sloped walls, it's bugged
					if (fover->top.plane->isSlope() || fover->bottom.plane->isSlope()) continue;

					// visible?
					if (fover->top.plane->Zat0() <= sclipBottom) continue; // no
					if (fover->bottom.plane->Zat0() >= sclipTop)
					{ // no, last possible
 						fover = NULL;
						break;
					}
					// it is, render inside?
					if (!(fover->flags & (FF_BOTHPLANES|FF_INVERTPLANES)))
					{ // no
						fover = NULL;
					}
					break;
				}
				// nothing
				if (!fover || j == -1)
				{
					break;
				}
				// correct texture
				if (fover->flags & rover->flags & FF_SWIMMABLE)
				{	// don't ever draw (but treat as something has been found)
					rw_pic = DONT_DRAW;
				}
				else if(fover->flags & FF_UPPERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::top), true);
				}
				else if(fover->flags & FF_LOWERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::bottom), true);
				}
				else
				{
					rw_pic = TexMan(fover->master->sidedef[0]->GetTexture(side_t::mid), true);
				}
			} 
			else if (frontsector->e->XFloor.ffloors.Size()) 
			{
				// maybe not visible?
				fover = NULL;
				for (j = frontsector->e->XFloor.ffloors.Size() - 1; j >= 0; j--)
				{
					fover = frontsector->e->XFloor.ffloors[j];
					if (fover->model == rover->model) // never
					{
						break;
					}
					if (!(fover->flags & FF_EXISTS)) continue;
					if (!(fover->flags & FF_RENDERSIDES)) continue;
					// no sloped walls, it's bugged
					if (fover->top.plane->isSlope() || fover->bottom.plane->isSlope()) continue;

					// visible?
					if (fover->top.plane->Zat0() <= sclipBottom) continue; // no
					if (fover->bottom.plane->Zat0() >= sclipTop)
					{ // visible, last possible
 						fover = NULL;
						break;
					}
					if ((fover->flags & FF_SOLID) == (rover->flags & FF_SOLID) &&
						!(!(fover->flags & FF_SOLID) && (fover->alpha == 255 || rover->alpha == 255))
					)
					{
						break;
					}
					if (fover->flags & rover->flags & FF_SWIMMABLE)
					{ // don't ever draw (but treat as something has been found)
						rw_pic = DONT_DRAW;
					}
					fover = NULL; // visible
					break;
				}
				if (fover && j != -1)
				{
					fover = NULL;
					last = 1;
					continue; // not visible
				}
			}
			if (!rw_pic) 
			{
				fover = NULL;
				if (rover->flags & FF_UPPERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::top), true);
				}
				else if(rover->flags & FF_LOWERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::bottom), true);
				}
				else
				{
					rw_pic = TexMan(rover->master->sidedef[0]->GetTexture(side_t::mid), true);
				}
			}
			// correct colors now
			basecolormap = frontsector->ColorMap;
			wallshade = ds->shade;
			if (fixedlightlev < 0)
			{
				if ((ds->bFakeBoundary & 3) == 2)
				{
					for (j = backsector->e->XFloor.lightlist.Size() - 1; j >= 0; j--)
					{
						if (sclipTop <= backsector->e->XFloor.lightlist[j].plane.Zat0())
						{
							lightlist_t *lit = &backsector->e->XFloor.lightlist[j];
							basecolormap = lit->extra_colormap;
							wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(foggy, *lit->p_lightlevel, lit->lightsource != NULL) + r_actualextralight);
							break;
						}
					}
				}
				else
				{
					for (j = frontsector->e->XFloor.lightlist.Size() - 1; j >= 0; j--)
					{
						if (sclipTop <= frontsector->e->XFloor.lightlist[j].plane.Zat0())
						{
							lightlist_t *lit = &frontsector->e->XFloor.lightlist[j];
							basecolormap = lit->extra_colormap;
							wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(foggy, *lit->p_lightlevel, lit->lightsource != NULL) + r_actualextralight);
							break;
						}
					}
				}
			}
			if (rw_pic != DONT_DRAW)
			{
				R_RenderFakeWall(ds, x1, x2, fover ? fover : rover);
			}
			else rw_pic = NULL;
			break;
		}
	}
	else
	{ // top to viewz
		for (i = 0; i < (int)backsector->e->XFloor.ffloors.Size(); i++)
		{
			rover = backsector->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_EXISTS)) continue;

			// visible?
			passed = 0;
			if (!(rover->flags & FF_RENDERSIDES) ||
				rover->top.plane->isSlope() || rover->bottom.plane->isSlope() ||
				rover->bottom.plane->Zat0() >= sclipTop ||
				rover->top.plane->Zat0() <= floorHeight ||
				rover->bottom.plane->Zat0() >= ceilingHeight)
			{
				if ((unsigned)i == backsector->e->XFloor.ffloors.Size() - 1)
				{
					passed = 1;
				}
				else
				{
					continue;
				}
			}
			rw_pic = NULL;
			if (rover->top.plane->Zat0() <= sclipBottom || passed)
			{ // maybe wall from inside rendering?
				fover = NULL;
				for (j = 0; j < (int)frontsector->e->XFloor.ffloors.Size(); j++)
				{
					fover = frontsector->e->XFloor.ffloors[j];
					if (fover->model == rover->model)
					{ // never
						fover = NULL;
						break;
					}
					if (!(fover->flags & FF_EXISTS)) continue;
					if (!(fover->flags & FF_RENDERSIDES)) continue;
					// no sloped walls, it's bugged
					if (fover->top.plane->isSlope() || fover->bottom.plane->isSlope()) continue;

					// visible?
					if (fover->bottom.plane->Zat0() >= sclipTop) continue; // no
					if (fover->top.plane->Zat0() <= sclipBottom)
					{ // no, last possible
 						fover = NULL;
						break;
					}
					// it is, render inside?
					if (!(fover->flags & (FF_BOTHPLANES|FF_INVERTPLANES)))
					{ // no
						fover = NULL;
					}
					break;
				}
				// nothing
				if (!fover || (unsigned)j == frontsector->e->XFloor.ffloors.Size())
				{
					break;
				}
				// correct texture
				if (fover->flags & rover->flags & FF_SWIMMABLE)
				{
					rw_pic = DONT_DRAW;	// don't ever draw (but treat as something has been found)
				}
				else if (fover->flags & FF_UPPERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::top), true);
				}
				else if (fover->flags & FF_LOWERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::bottom), true);
				}
				else
				{
					rw_pic = TexMan(fover->master->sidedef[0]->GetTexture(side_t::mid), true);
				}
			}
			else if (frontsector->e->XFloor.ffloors.Size())
			{ // maybe not visible?
				fover = NULL;
				for (j = 0; j < (int)frontsector->e->XFloor.ffloors.Size(); j++)
				{
					fover = frontsector->e->XFloor.ffloors[j];
					if (fover->model == rover->model)
					{ // never
						break;
					}
					if (!(fover->flags & FF_EXISTS)) continue;
					if (!(fover->flags & FF_RENDERSIDES)) continue;
					// no sloped walls, its bugged
					if (fover->top.plane->isSlope() || fover->bottom.plane->isSlope()) continue;

					// visible?
					if (fover->bottom.plane->Zat0() >= sclipTop) continue; // no
					if (fover->top.plane->Zat0() <= sclipBottom)
					{ // visible, last possible
 						fover = NULL;
						break;
					}
					if ((fover->flags & FF_SOLID) == (rover->flags & FF_SOLID) &&
						!(!(rover->flags & FF_SOLID) && (fover->alpha == 255 || rover->alpha == 255))
					)
					{
						break;
					}
					if (fover->flags & rover->flags & FF_SWIMMABLE)
					{ // don't ever draw (but treat as something has been found)
						rw_pic = DONT_DRAW;
					}
					fover = NULL; // visible
					break;
				}
				if (fover && (unsigned)j != frontsector->e->XFloor.ffloors.Size())
				{ // not visible
					break;
				}
			}
			if (rw_pic == NULL)
			{
				fover = NULL;
				if (rover->flags & FF_UPPERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::top), true);
				}
				else if (rover->flags & FF_LOWERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::bottom), true);
				}
				else
				{
					rw_pic = TexMan(rover->master->sidedef[0]->GetTexture(side_t::mid), true);
				}
			}
			// correct colors now
			basecolormap = frontsector->ColorMap;
			wallshade = ds->shade;
			if (fixedlightlev < 0)
			{
				if ((ds->bFakeBoundary & 3) == 2)
				{
					for (j = backsector->e->XFloor.lightlist.Size() - 1; j >= 0; j--)
					{
						if (sclipTop <= backsector->e->XFloor.lightlist[j].plane.Zat0())
						{
							lightlist_t *lit = &backsector->e->XFloor.lightlist[j];
							basecolormap = lit->extra_colormap;
							wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(foggy, *lit->p_lightlevel, lit->lightsource != NULL) + r_actualextralight);
							break;
						}
					}
				}
				else
				{
					for (j = frontsector->e->XFloor.lightlist.Size() - 1; j >= 0; j--)
					{
						if(sclipTop <= frontsector->e->XFloor.lightlist[j].plane.Zat0())
						{
							lightlist_t *lit = &frontsector->e->XFloor.lightlist[j];
							basecolormap = lit->extra_colormap;
							wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(foggy, *lit->p_lightlevel, lit->lightsource != NULL) + r_actualextralight);
							break;
						}
					}
				}
			}

			if (rw_pic != DONT_DRAW)
			{
				R_RenderFakeWall(ds, x1, x2, fover ? fover : rover);
			}
			else
			{
				rw_pic = NULL;
			}
			break;
		}
	}
	return;
}